

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O2

DFsSection * __thiscall DFsScript::NewSection(DFsScript *this,char *brace)

{
  char *pcVar1;
  TObjPtr<DFsSection> this_00;
  int iVar2;
  
  pcVar1 = this->data;
  this_00.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)DObject::operator_new(0x40);
  DFsSection::DFsSection((DFsSection *)this_00.field_0);
  iVar2 = ((int)brace - (int)pcVar1) % 0x11;
  *(int *)((long)this_00.field_0 + 0x28) = (int)brace - *(int *)&this->data;
  ((TObjPtr<DFsSection> *)((long)this_00.field_0 + 0x38))->field_0 = this->sections[iVar2].field_0;
  this->sections[iVar2].field_0 = this_00.field_0;
  if (((*(byte *)((long)this_00.field_0 + 0x20) & 3) != 0) &&
     (((this->super_DObject).ObjectFlags & 4) != 0)) {
    GC::Barrier(&this->super_DObject,(DObject *)this_00.field_0);
  }
  return (DFsSection *)this_00.field_0;
}

Assistant:

DFsSection *DFsScript::NewSection(const char *brace)
{
	int n = section_hash(brace);
	DFsSection *newsec = new DFsSection;
	
	newsec->start_index = MakeIndex(brace);
	newsec->next = sections[n];
	sections[n] = newsec;
	GC::WriteBarrier(this, newsec);
	return newsec;
}